

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O2

void __thiscall
duckdb::MetadataWriter::WriteData(MetadataWriter *this,const_data_ptr_t buffer,idx_t write_size)

{
  data_ptr_t pdVar1;
  size_t __n;
  
  while( true ) {
    if (this->offset + write_size <= this->capacity) break;
    __n = this->capacity - this->offset;
    if (__n != 0) {
      pdVar1 = Ptr(this);
      switchD_016b45db::default(pdVar1,buffer,__n);
      buffer = buffer + __n;
      this->offset = this->offset + __n;
      write_size = write_size - __n;
    }
    NextBlock(this);
  }
  pdVar1 = Ptr(this);
  switchD_016b45db::default(pdVar1,buffer,write_size);
  this->offset = this->offset + write_size;
  return;
}

Assistant:

void MetadataWriter::WriteData(const_data_ptr_t buffer, idx_t write_size) {
	while (offset + write_size > capacity) {
		// we need to make a new block
		// first copy what we can
		D_ASSERT(offset <= capacity);
		idx_t copy_amount = capacity - offset;
		if (copy_amount > 0) {
			memcpy(Ptr(), buffer, copy_amount);
			buffer += copy_amount;
			offset += copy_amount;
			write_size -= copy_amount;
		}
		// move forward to the next block
		NextBlock();
	}
	memcpy(Ptr(), buffer, write_size);
	offset += write_size;
}